

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsClient.cpp
# Opt level: O0

int xs::runClient(int argc,char **argv)

{
  deBool dVar1;
  int port;
  char *host;
  char *str;
  char *str_00;
  char *str_01;
  char *str_02;
  char *str_03;
  char *str_04;
  exception *e;
  Client client;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  char *local_d8;
  char *arg;
  int argNdx;
  undefined1 local_c0 [8];
  CommandLine cmdLine;
  char **argv_local;
  int argc_local;
  
  cmdLine.dstFileName.field_2._8_8_ = argv;
  CommandLine::CommandLine((CommandLine *)local_c0);
  de::SocketAddress::setHost((SocketAddress *)local_c0,"127.0.0.1");
  de::SocketAddress::setPort((SocketAddress *)local_c0,0xc360);
  std::__cxx11::string::operator=
            ((string *)(cmdLine.caseList.field_2._M_local_buf + 8),"TestResults.qpa");
  arg._0_4_ = 1;
  do {
    if (argc <= (int)arg) {
      Client::Client((Client *)&e,(CommandLine *)local_c0);
      Client::run((Client *)&e);
      Client::~Client((Client *)&e);
      argv_local._4_4_ = 0;
LAB_00109c1c:
      client.m_socket.m_socket._4_4_ = 1;
      CommandLine::~CommandLine((CommandLine *)local_c0);
      return argv_local._4_4_;
    }
    local_d8 = *(char **)(cmdLine.dstFileName.field_2._8_8_ + (long)(int)arg * 8);
    dVar1 = deStringBeginsWith(local_d8,"--port=");
    if (dVar1 == 0) {
      dVar1 = deStringBeginsWith(local_d8,"--host=");
      if (dVar1 == 0) {
        dVar1 = deStringBeginsWith(local_d8,"--program=");
        if (dVar1 == 0) {
          dVar1 = deStringBeginsWith(local_d8,"--params=");
          if (dVar1 == 0) {
            dVar1 = deStringBeginsWith(local_d8,"--workdir=");
            if (dVar1 == 0) {
              dVar1 = deStringBeginsWith(local_d8,"--caselist=");
              if (dVar1 == 0) {
                dVar1 = deStringBeginsWith(local_d8,"--out=");
                if (dVar1 == 0) {
                  printHelp(*(char **)cmdLine.dstFileName.field_2._8_8_);
                  argv_local._4_4_ = -1;
                  goto LAB_00109c1c;
                }
                parseString_abi_cxx11_(&local_198,(xs *)(local_d8 + 6),str_04);
                std::__cxx11::string::operator=
                          ((string *)(cmdLine.caseList.field_2._M_local_buf + 8),
                           (string *)&local_198);
                std::__cxx11::string::~string((string *)&local_198);
              }
              else {
                parseString_abi_cxx11_(&local_178,(xs *)(local_d8 + 0xb),str_03);
                std::__cxx11::string::operator=
                          ((string *)(cmdLine.workingDir.field_2._M_local_buf + 8),
                           (string *)&local_178);
                std::__cxx11::string::~string((string *)&local_178);
              }
            }
            else {
              parseString_abi_cxx11_(&local_158,(xs *)(local_d8 + 10),str_02);
              std::__cxx11::string::operator=
                        ((string *)(cmdLine.params.field_2._M_local_buf + 8),(string *)&local_158);
              std::__cxx11::string::~string((string *)&local_158);
            }
          }
          else {
            parseString_abi_cxx11_(&local_138,(xs *)(local_d8 + 9),str_01);
            std::__cxx11::string::operator=
                      ((string *)(cmdLine.program.field_2._M_local_buf + 8),(string *)&local_138);
            std::__cxx11::string::~string((string *)&local_138);
          }
        }
        else {
          parseString_abi_cxx11_(&local_118,(xs *)(local_d8 + 10),str_00);
          std::__cxx11::string::operator=((string *)&cmdLine,(string *)&local_118);
          std::__cxx11::string::~string((string *)&local_118);
        }
      }
      else {
        parseString_abi_cxx11_(&local_f8,(xs *)(local_d8 + 7),str);
        host = (char *)std::__cxx11::string::c_str();
        de::SocketAddress::setHost((SocketAddress *)local_c0,host);
        std::__cxx11::string::~string((string *)&local_f8);
      }
    }
    else {
      port = atoi(local_d8 + 7);
      de::SocketAddress::setPort((SocketAddress *)local_c0,port);
    }
    arg._0_4_ = (int)arg + 1;
  } while( true );
}

Assistant:

int runClient (int argc, const char* const* argv)
{
	CommandLine cmdLine;

	// Defaults.
	cmdLine.address.setHost("127.0.0.1");
	cmdLine.address.setPort(50016);
	cmdLine.dstFileName = "TestResults.qpa";

	// Parse command line.
	for (int argNdx = 1; argNdx < argc; argNdx++)
	{
		const char* arg = argv[argNdx];

		if (deStringBeginsWith(arg, "--port="))
			cmdLine.address.setPort(atoi(arg+7));
		else if (deStringBeginsWith(arg, "--host="))
			cmdLine.address.setHost(parseString(arg+7).c_str());
		else if (deStringBeginsWith(arg, "--program="))
			cmdLine.program = parseString(arg+10);
		else if (deStringBeginsWith(arg, "--params="))
			cmdLine.params = parseString(arg+9);
		else if (deStringBeginsWith(arg, "--workdir="))
			cmdLine.workingDir = parseString(arg+10);
		else if (deStringBeginsWith(arg, "--caselist="))
			cmdLine.caseList = parseString(arg+11);
		else if  (deStringBeginsWith(arg, "--out="))
			cmdLine.dstFileName = parseString(arg+6);
		else
		{
			printHelp(argv[0]);
			return -1;
		}
	}

	// Run client.
	try
	{
		Client client(cmdLine);
		client.run();
	}
	catch (const std::exception& e)
	{
		printf("%s\n", e.what());
		return -1;
	}

	return 0;
}